

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O3

string * EncodeDestination_abi_cxx11_(string *__return_storage_ptr__,CTxDestination *dest)

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  DestinationEncoder local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_params = Params();
  lVar1 = (long)(char)(dest->
                      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ).
                      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ._M_index;
  if (lVar1 == -1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_003d8138;
    puVar2[1] = "std::visit: variant is valueless";
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
    }
  }
  else {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(anonymous_namespace)::DestinationEncoder_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
      ::_S_vtable._M_arr[lVar1]._M_data)(__return_storage_ptr__,&local_20,dest);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeDestination(const CTxDestination& dest)
{
    return std::visit(DestinationEncoder(Params()), dest);
}